

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_armor.cpp
# Opt level: O2

AInventory * __thiscall ABasicArmorBonus::CreateCopy(ABasicArmorBonus *this,AActor *other)

{
  int iVar1;
  AInventory *pAVar2;
  double dVar3;
  
  pAVar2 = AInventory::CreateCopy((AInventory *)this,other);
  iVar1 = this->SaveAmount;
  if (((this->super_AArmor).super_AInventory.ItemFlags & 0x4000) == 0) {
    dVar3 = G_SkillProperty(SKILLP_ArmorFactor);
    iVar1 = (int)(dVar3 * (double)iVar1);
    this->SaveAmount = iVar1;
  }
  pAVar2[1].super_AActor.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)this->SavePercent;
  *(int *)((long)&pAVar2[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4) = iVar1;
  pAVar2[1].super_AActor.super_DThinker.super_DObject.GCNext = *(DObject **)&this->BonusCount;
  pAVar2[1].super_AActor.super_DThinker.super_DObject.Class = *(PClass **)&this->MaxSaveAmount;
  *(int *)&pAVar2[1].super_AActor.super_DThinker.super_DObject.ObjNext = this->MaxFullAbsorb;
  return pAVar2;
}

Assistant:

AInventory *ABasicArmorBonus::CreateCopy (AActor *other)
{
	ABasicArmorBonus *copy = static_cast<ABasicArmorBonus *> (Super::CreateCopy (other));

	if (!(ItemFlags & IF_IGNORESKILL))
	{
		SaveAmount = int(SaveAmount * G_SkillProperty(SKILLP_ArmorFactor));
	}

	copy->SavePercent = SavePercent;
	copy->SaveAmount = SaveAmount;
	copy->MaxSaveAmount = MaxSaveAmount;
	copy->BonusCount = BonusCount;
	copy->BonusMax = BonusMax;
	copy->MaxAbsorb = MaxAbsorb;
	copy->MaxFullAbsorb = MaxFullAbsorb;

	return copy;
}